

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.cpp
# Opt level: O3

void __thiscall cpp_db::transaction::commit(transaction *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Atomic_word _Var2;
  bool bVar3;
  
  (*((this->trans_impl).
     super___shared_ptr<cpp_db::transaction_interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_transaction_interface[3])();
  tools::do_check<cpp_db::connection_interface>(&this->conn_impl,"Invalid database connection");
  this_00 = (this->conn_impl).
            super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  _Var2 = this_00->_M_use_count;
  do {
    LOCK();
    iVar1 = this_00->_M_use_count;
    bVar3 = _Var2 == iVar1;
    if (bVar3) {
      this_00->_M_use_count = _Var2 + 1;
      iVar1 = _Var2;
    }
    _Var2 = iVar1;
    UNLOCK();
  } while (!bVar3);
  (*((this->conn_impl).super___weak_ptr<cpp_db::connection_interface,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr)->_vptr_connection_interface[6])();
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void transaction::commit()
{
	trans_impl->commit();
    tools::lock_or_throw(conn_impl, "Invalid database connection")->set_current_transaction(nullptr);
}